

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2obj.cpp
# Opt level: O2

void pbrt::pbrt2obj(int ac,char **av)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  int iVar4;
  allocator local_f9;
  runtime_error e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  pointer local_d8;
  pointer psStack_d0;
  shared_ptr<pbrt::Scene> scene;
  string inFileName;
  string local_80;
  __shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> local_60;
  string outFileName;
  
  inFileName._M_dataplus._M_p = (pointer)&inFileName.field_2;
  inFileName._M_string_length = 0;
  inFileName.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&outFileName,"a.obj",(allocator *)&e);
  iVar4 = 1;
  do {
    if (ac <= iVar4) {
      std::ofstream::open((string *)out,(_Ios_Openmode)&outFileName);
      defineDefaultMaterials((ofstream *)out);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "-------------------------------------------------------");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,"parsing: ");
      poVar2 = std::operator<<(poVar2,(string *)&inFileName);
      std::endl<char,std::char_traits<char>>(poVar2);
      scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
      ;
      scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__cxx11::string::string((string *)&e,".pbrt",(allocator *)&local_80);
      bVar1 = endsWith(&inFileName,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if (bVar1) {
        std::__cxx11::string::string((string *)&e,"",&local_f9);
        importPBRT(&local_80,&inFileName);
        std::__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> *)&local_80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
        std::__cxx11::string::~string((string *)&e);
      }
      else {
        std::__cxx11::string::string((string *)&e,".pbf",(allocator *)&local_80);
        bVar1 = endsWith(&inFileName,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        if (!bVar1) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"un-recognized input file extension");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        Scene::loadFrom((Scene *)&e,&inFileName);
        std::__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2> *)&e);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
      }
      poVar2 = std::operator<<((ostream *)&std::cout," => yay! parsing successful...");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "done parsing, now exporting (triangular geometry from) scene");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,
                 &((scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->world
                  ).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>);
      _e = (pointer)0x3f800000;
      _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e8._M_allocated_capacity = 0x3f800000;
      local_e8._8_8_ = 0;
      local_d8 = (pointer)0x3f800000;
      psStack_d0 = (pointer)0x0;
      writeObject((SP *)&local_60,(affine3f *)&e);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&scene.super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&outFileName);
      std::__cxx11::string::~string((string *)&inFileName);
      return;
    }
    std::__cxx11::string::string((string *)&e,av[iVar4],(allocator *)&scene);
    if (*_e == '-') {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &e,"-o");
      if (!bVar1) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_80,"invalid argument \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scene,
                       &local_80,"\'");
        std::runtime_error::runtime_error(prVar3,(string *)&scene);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::assign((char *)&outFileName);
      iVar4 = iVar4 + 1;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&inFileName);
    }
    std::__cxx11::string::~string((string *)&e);
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void pbrt2obj(int ac, char **av)
  {
    std::string inFileName;
    std::string outFileName = "a.obj";
    for (int i=1;i<ac;i++) {
      const std::string arg = av[i];
      if (arg[0] == '-') {
        if (arg == "-o")
          outFileName = av[++i];
        else
          throw std::runtime_error("invalid argument '"+arg+"'");
      } else {
        inFileName = arg;
      }          
    }
    out.open(outFileName);
    // out = fopen(outFileName.c_str(),"w");
    assert(out.good());

    defineDefaultMaterials(out);
    
  
    std::cout << "-------------------------------------------------------" << std::endl;
    std::cout << "parsing: " << inFileName << std::endl;
      
    std::shared_ptr<Scene> scene;
    try {
      if (endsWith(inFileName,".pbrt"))
        scene = importPBRT(inFileName);
      else if (endsWith(inFileName,".pbf"))
        scene = Scene::loadFrom(inFileName);
      else
        throw std::runtime_error("un-recognized input file extension");
        
      std::cout << " => yay! parsing successful..." << std::endl;
        
      std::cout << "done parsing, now exporting (triangular geometry from) scene" << std::endl;
      writeObject(scene->world,affine3f::identity());
    } catch (std::runtime_error e) {
      std::cerr << "**** ERROR IN PARSING ****" << std::endl << e.what() << std::endl;
      std::cerr << "(this means that either there's something wrong with that PBRT file, or that the parser can't handle it)" << std::endl;
      exit(1);
    }
  }